

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

bool __thiscall ExecutorRegVm::Run(ExecutorRegVm *this,uint functionID,char *arguments)

{
  FastVector<char,_true,_true> *this_00;
  uint uVar1;
  uint *__dest;
  RegVmReturnType RVar2;
  int iVar3;
  uint uVar4;
  RegVmCmd *pRVar5;
  ExternFuncInfo *pEVar6;
  size_t sVar7;
  ExternTypeInfo *pEVar8;
  ExternMemberInfo *pEVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  Linker *pLVar13;
  RegVmRegister *pRVar14;
  byte bVar15;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *regFilePtr;
  char *pcVar16;
  bool bVar17;
  RegVmReturnType local_64;
  RegVmCmd *local_38;
  
  pLVar13 = this->exLinker;
  if ((pLVar13->exRegVmCode).count == 0) {
    Stop(this,"ERROR: module contains no code");
    return false;
  }
  if ((functionID == 0xffffffff) || (this->codeRunning == false)) {
    InitExecution(this);
    pLVar13 = this->exLinker;
  }
  this->codeRunning = true;
  pRVar5 = FastVector<RegVmCmd,_false,_false>::operator[](&pLVar13->exRegVmCode,0);
  this->codeBase = pRVar5;
  pRVar5 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,0);
  uVar1 = this->lastFinalReturn;
  uVar11 = (this->dataStack).count;
  this->lastFinalReturn = (this->callStack).count;
  this_00 = &this->dataStack;
  if (functionID == 0xffffffff) {
    uVar4 = this->exLinker->globalVarSize;
    if (uVar11 < uVar4) {
      __assert_fail("dataStack.size() >= exLinker->globalVarSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x115,"bool ExecutorRegVm::Run(unsigned int, const char *)");
    }
    regFilePtr = &this->regFileLastTop->field_0;
    local_64 = rvrVoid;
    memset((this->dataStack).data,0,(ulong)uVar4);
    *regFilePtr = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
    regFilePtr[1] = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
    regFilePtr[2] =
         (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
    regFilePtr[3].longValue = (int64_t)regFilePtr;
    memset(regFilePtr + 4,0,0x7e0);
    pRVar14 = this->regFileLastTop;
    this->regFileLastTop = (RegVmRegister *)(regFilePtr + 0x100);
LAB_0012a956:
    RVar2 = RunCode(pRVar5,(RegVmRegister *)regFilePtr,this,this->codeBase);
    bVar15 = 0;
  }
  else {
    __dest = this->tempStackArrayBase;
    pEVar6 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,functionID);
    uVar4 = pEVar6->regVmAddress;
    local_64 = GetFunctionVmReturnType
                         (pEVar6,this->exTypes->data,(this->exLinker->exTypeExtra).data);
    if (uVar4 == 0xffffffff) {
      memcpy(__dest,arguments,(ulong)pEVar6->argumentSize);
      if (pEVar6->funcPtrWrap == (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
        Stop(this,"ERROR: external raw function calls are disabled");
        bVar15 = 1;
      }
      else {
        (*pEVar6->funcPtrWrap)(pEVar6->funcPtrWrapTarget,(char *)__dest,(char *)__dest);
        bVar15 = this->callContinue ^ 1;
      }
    }
    else {
      pRVar5 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,uVar4);
      uVar4 = pEVar6->argumentSize;
      uVar12 = (this->dataStack).count;
      uVar10 = 0x10 - (uVar12 & 0xf);
      if ((uVar12 & 0xf) == 0) {
        uVar10 = 0;
      }
      if (uVar12 + uVar10 + uVar4 < (this->dataStack).max) {
        memcpy((this->dataStack).data + (ulong)uVar10 + (ulong)uVar12,arguments,(ulong)uVar4);
        uVar12 = (this->dataStack).count;
        if ((uVar12 & 0xf) != 0) {
          __assert_fail("dataStack.size() % 16 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                        ,0xf6,"bool ExecutorRegVm::Run(unsigned int, const char *)");
        }
        uVar10 = pEVar6->stackSize + 0xf & 0xfffffff0;
        regFilePtr = &this->regFileLastTop->field_0;
        iVar3 = pEVar6->regVmRegisters;
        uVar12 = uVar12 + uVar10;
        if (uVar12 < (this->dataStack).max) {
          FastVector<char,_true,_true>::resize(this_00,uVar12);
          if (uVar10 < uVar4) {
            __assert_fail("argumentsSize <= stackSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                          ,0x103,"bool ExecutorRegVm::Run(unsigned int, const char *)");
          }
          if (uVar10 != uVar4) {
            memset(this_00->data + (ulong)uVar4 + (ulong)uVar11,0,(ulong)(uVar10 - uVar4));
          }
          *regFilePtr = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
          regFilePtr[1].longValue = (int64_t)((this->dataStack).data + uVar11);
          regFilePtr[2] =
               (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
          regFilePtr[3].longValue = (int64_t)regFilePtr;
        }
        else {
          local_38 = pRVar5 + 1;
          FastVector<RegVmCmd_*,_false,_false>::push_back(&this->callStack,&local_38);
          Stop(this,"ERROR: stack overflow");
          local_64 = rvrError;
          pRVar5 = (RegVmCmd *)0x0;
        }
        bVar15 = 0;
        memset(regFilePtr + 4,0,(long)iVar3 * 8 - 0x20);
        pRVar14 = this->regFileLastTop;
        this->regFileLastTop = (RegVmRegister *)(regFilePtr + iVar3);
        RVar2 = local_64;
        if (pRVar5 == (RegVmCmd *)0x0) goto LAB_0012a99d;
        goto LAB_0012a956;
      }
      local_38 = pRVar5 + 1;
      FastVector<RegVmCmd_*,_false,_false>::push_back(&this->callStack,&local_38);
      Stop(this,"ERROR: stack overflow");
      local_64 = rvrError;
      bVar15 = 0;
    }
    pRVar14 = this->regFileLastTop;
    RVar2 = local_64;
  }
LAB_0012a99d:
  this->regFileLastTop = pRVar14;
  FastVector<char,_true,_true>::shrink(this_00,uVar11);
  if (RVar2 != rvrError) {
    if ((local_64 != rvrVoid) && (bVar17 = local_64 != RVar2, RVar2 = local_64, bVar17)) {
      __assert_fail("retType == resultType && \"expected different result\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x136,"bool ExecutorRegVm::Run(unsigned int, const char *)");
    }
    if (bVar15 == 0) {
      this->lastFinalReturn = uVar1;
      if (functionID != 0xffffffff) {
        pEVar6 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,functionID);
        pEVar8 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                           (this->exTypes,pEVar6->funcType);
        pEVar9 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                           (&this->exLinker->exTypeExtra,(pEVar8->field_11).subType);
        this->tempStackType = pEVar9->type;
        return true;
      }
      this->tempStackType = 0;
      if (RVar2 == rvrDouble) {
        this->tempStackType = 7;
        return true;
      }
      if (RVar2 == rvrLong) {
        this->tempStackType = 5;
        return true;
      }
      if (RVar2 != rvrInt) {
        return true;
      }
      this->tempStackType = 4;
      return true;
    }
  }
  uVar11 = this->lastFinalReturn;
  if (uVar11 == 0) {
    pcVar16 = this->execErrorBuffer;
    sVar7 = strlen(pcVar16);
    pcVar16 = pcVar16 + sVar7;
    uVar11 = 0;
    iVar3 = NULLC::SafeSprintf(pcVar16,(long)(0x10000 - (int)sVar7),"\r\nCall stack:\r\n");
    pcVar16 = pcVar16 + iVar3;
    while (uVar4 = GetCallStackAddress(this,uVar11), uVar4 != 0) {
      uVar11 = uVar11 + 1;
      uVar4 = PrintStackFrame(uVar4,pcVar16,
                              (*(int *)&this->execErrorBuffer - (int)pcVar16) + 0x10000,false);
      pcVar16 = pcVar16 + uVar4;
    }
    uVar11 = this->lastFinalReturn;
  }
  this->execErrorFinalReturnDepth = uVar11;
  this->lastFinalReturn = uVar1;
  this->callContinue = false;
  this->codeRunning = false;
  return false;
}

Assistant:

bool ExecutorRegVm::Run(unsigned functionID, const char *arguments)
{
	if(exLinker->exRegVmCode.empty())
	{
		Stop("ERROR: module contains no code");
		return false;
	}

	if(!codeRunning || functionID == ~0u)
		InitExecution();

	codeRunning = true;

	RegVmReturnType retType = rvrVoid;

	codeBase = &exLinker->exRegVmCode[0];
	RegVmCmd *instruction = &exLinker->exRegVmCode[0];

	bool errorState = false;

	// We will know that return is global if call stack size is equal to current
	unsigned prevLastFinalReturn = lastFinalReturn;
	lastFinalReturn = callStack.size();

	unsigned prevDataSize = dataStack.size();

	RegVmRegister *regFilePtr = regFileLastTop;
	RegVmRegister *regFileTop = regFilePtr + 256;

	unsigned *tempStackPtr = tempStackArrayBase;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];

		unsigned funcPos = ~0u;
		funcPos = target.regVmAddress;

		retType = (RegVmReturnType)GetFunctionVmReturnType(target, exTypes.data, exLinker->exTypeExtra.data);

		if(funcPos == ~0u)
		{
			// Copy all arguments
			memcpy(tempStackPtr, arguments, target.argumentSize);

			// Call function
			if(target.funcPtrWrap)
			{
				target.funcPtrWrap(target.funcPtrWrapTarget, (char*)tempStackPtr, (char*)tempStackPtr);

				if(!callContinue)
					errorState = true;
			}
			else
			{
				if(!RunExternalFunction(functionID, tempStackPtr))
					errorState = true;
			}

			// This will disable NULLC code execution while leaving error check and result retrieval
			instruction = NULL;
		}
		else
		{
			instruction = &exLinker->exRegVmCode[funcPos];

			unsigned argumentsSize = target.argumentSize;

			// Keep stack frames aligned to 16 byte boundary
			unsigned alignOffset = (dataStack.size() % 16 != 0) ? (16 - (dataStack.size() % 16)) : 0;

			if(dataStack.size() + alignOffset + argumentsSize >= dataStack.max)
			{
				callStack.push_back(instruction + 1);
				instruction = NULL;
				Stop("ERROR: stack overflow");
				retType = rvrError;
			}
			else
			{
				// Copy arguments to new stack frame
				memcpy((char*)(dataStack.data + dataStack.size() + alignOffset), arguments, argumentsSize);

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

				regFilePtr = regFileLastTop;
				regFileTop = regFilePtr + target.regVmRegisters;

				assert(dataStack.size() % 16 == 0);

				if(dataStack.size() + stackSize >= dataStack.max)
				{
					callStack.push_back(instruction + 1);
					instruction = NULL;
					Stop("ERROR: stack overflow");
					retType = rvrError;
				}
				else
				{
					dataStack.resize(dataStack.size() + stackSize);

					assert(argumentsSize <= stackSize);

					if(stackSize - argumentsSize)
						memset(dataStack.data + prevDataSize + argumentsSize, 0, stackSize - argumentsSize);

					regFilePtr[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
					regFilePtr[rvrrFrame].ptrValue = uintptr_t(dataStack.data + prevDataSize);
					regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
					regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);
				}

				memset(regFilePtr + rvrrCount, 0, (regFileTop - regFilePtr - rvrrCount) * sizeof(regFilePtr[0]));
			}
		}
	}
	else
	{
		// If global code is executed, reset all global variables
		assert(dataStack.size() >= exLinker->globalVarSize);
		memset(dataStack.data, 0, exLinker->globalVarSize);

		regFilePtr[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
		regFilePtr[rvrrFrame].ptrValue = uintptr_t(dataStack.data);
		regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
		regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);

		memset(regFilePtr + rvrrCount, 0, (regFileTop - regFilePtr - rvrrCount) * sizeof(regFilePtr[0]));
	}

	RegVmRegister *prevRegFileLastTop = regFileLastTop;

	regFileLastTop = regFileTop;

	RegVmReturnType resultType = retType;

	if(instruction)
		resultType = RunCode(instruction, regFilePtr, this, codeBase);

	regFileLastTop = prevRegFileLastTop;

	dataStack.shrink(prevDataSize);

	if(resultType == rvrError)
	{
		errorState = true;
	}
	else
	{
		if(retType == rvrVoid)
			retType = resultType;
		else
			assert(retType == resultType && "expected different result");
	}

	// If there was an execution error
	if(errorState)
	{
		// Print call stack on error, when we get to the first function
		if(lastFinalReturn == 0)
		{
			char *currPos = execErrorBuffer + strlen(execErrorBuffer);
			currPos += NULLC::SafeSprintf(currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), "\r\nCall stack:\r\n");

			unsigned currentFrame = 0;
			while(unsigned address = GetCallStackAddress(currentFrame++))
				currPos += PrintStackFrame(address, currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), false);
		}

		execErrorFinalReturnDepth = lastFinalReturn;
		lastFinalReturn = prevLastFinalReturn;

		// Ascertain that execution stops when there is a chain of nullcRunFunction
		callContinue = false;
		codeRunning = false;

		return false;
	}

	lastFinalReturn = prevLastFinalReturn;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];
		ExternTypeInfo &targetType = exTypes[target.funcType];

		tempStackType = exLinker->exTypeExtra[targetType.memberOffset].type;
	}
	else
	{
		tempStackType = NULLC_TYPE_VOID;

		switch(retType)
		{
		case rvrInt:
			tempStackType = NULLC_TYPE_INT;
			break;
		case rvrDouble:
			tempStackType = NULLC_TYPE_DOUBLE;
			break;
		case rvrLong:
			tempStackType = NULLC_TYPE_LONG;
			break;
		default:
			break;
		}
	}

	return true;
}